

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::CompressionParameters> *
kj::_::tryExtractParameters
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,
          Vector<kj::ArrayPtr<const_char>_> *configuration,bool isAgreement)

{
  KeyMaybeVal *pKVar1;
  size_t sVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 config;
  Array<kj::_::KeyMaybeVal> keyMaybeValuePairs;
  ArrayPtr<kj::ArrayPtr<const_char>_> params;
  Maybe<kj::_::UnverifiedConfig> maybeUnverified;
  Array<kj::_::KeyMaybeVal> local_b8;
  Maybe<kj::CompressionParameters> local_a0;
  ArrayPtr<kj::ArrayPtr<const_char>_> local_70;
  Maybe<kj::_::UnverifiedConfig> local_60;
  
  local_70.ptr = (configuration->builder).ptr;
  lVar5 = (long)(configuration->builder).pos - (long)local_70.ptr;
  if (lVar5 == 0x10) {
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = 0;
    (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = false;
    (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = false;
    return __return_storage_ptr__;
  }
  local_70.ptr = local_70.ptr + 1;
  local_70.size_ = (lVar5 >> 4) - 1;
  toKeysAndVals(&local_b8,&local_70);
  populateUnverifiedConfig(&local_60,&local_b8);
  if (local_60.ptr.isSet == true) {
    config = &local_60.ptr.field_1;
    uVar6 = validateCompressionConfig(&local_a0,(UnverifiedConfig *)config,isAgreement);
    uVar4 = local_a0.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet;
    uVar3 = local_a0.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
    if (local_a0.ptr.isSet == true) {
      if (local_a0.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
        local_a0.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet = false;
        uVar6 = local_a0.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
      }
      if (local_a0.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
        local_a0.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet = false;
        config = local_a0.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
      }
      (__return_storage_ptr__->ptr).isSet = true;
      *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = local_a0.ptr.field_1._0_2_;
      (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = (bool)uVar3;
      if ((bool)uVar3 != false) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar6;
      }
      (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = (bool)uVar4;
      if ((bool)uVar4 != false) {
        ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
        ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20))->value = config;
      }
      goto LAB_003e9992;
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
LAB_003e9992:
  sVar2 = local_b8.size_;
  pKVar1 = local_b8.ptr;
  if (local_b8.ptr != (KeyMaybeVal *)0x0) {
    local_b8.ptr = (KeyMaybeVal *)0x0;
    local_b8.size_ = 0;
    (**(local_b8.disposer)->_vptr_ArrayDisposer)
              (local_b8.disposer,pKVar1,0x28,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::KeyMaybeVal>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

inline kj::Maybe<CompressionParameters> tryExtractParameters(
    kj::Vector<kj::ArrayPtr<const char>>& configuration,
    bool isAgreement) {
  // If the `configuration` is structured correctly and has no invalid parameters/values, we will
  // return a populated `CompressionParameters` struct.
  if (configuration.size() == 1) {
    // Plain `permessage-deflate`.
    return CompressionParameters{};
  }
  auto params = configuration.slice(1, configuration.size());
  auto keyMaybeValuePairs = toKeysAndVals(params);
  // Parse parameter strings into parameter[=value] pairs.
  auto maybeUnverified = populateUnverifiedConfig(keyMaybeValuePairs);
  KJ_IF_SOME(unverified, maybeUnverified) {
    // Parsing succeeded, i.e. the parameter (`key`) names are valid and we don't have
    // values for `x_no_context_takeover` parameters (the configuration is structured correctly).
    // All that's left is to check the `x_max_window_bits` values (if any are present).
    KJ_IF_SOME(validConfig, validateCompressionConfig(kj::mv(unverified), isAgreement)) {
      return kj::mv(validConfig);
    }
  }
  return kj::none;
}